

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O0

void __thiscall TrivialRETest_Runnings_Test::TestBody(TrivialRETest_Runnings_Test *this)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_17;
  initializer_list<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  __l_18;
  string_view str;
  bool bVar1;
  const_reference pvVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar5;
  size_type sVar6;
  const_pointer pvVar7;
  const_reference pvVar8;
  Message *pMVar9;
  char *pcVar10;
  char *in_R9;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_cb8;
  string local_b78;
  AssertHelper local_b58;
  Message local_b50;
  basic_string_view<char,_std::char_traits<char>_> local_b48;
  bool local_b31;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b00;
  Message local_af8;
  basic_string_view<char,_std::char_traits<char>_> local_af0;
  bool local_ad9;
  undefined1 local_ad8 [8];
  AssertionResult gtest_ar_;
  string_view s;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_ab0;
  size_t i;
  StringTestingBuilder local_a89;
  C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy> local_a88;
  Matcher local_a70;
  allocator<char> local_a49;
  string local_a48 [32];
  trivialre *local_a28;
  char *pcStack_a20;
  undefined1 local_a10 [8];
  Matcher m;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *vec;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  *__range1;
  basic_string_view<char,_std::char_traits<char>_> local_9c8;
  undefined8 local_9b8;
  char *pcStack_9b0;
  undefined8 local_9a8;
  char *pcStack_9a0;
  undefined8 local_998;
  char *pcStack_990;
  iterator local_980;
  size_type local_978;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_969;
  basic_string_view<char,_std::char_traits<char>_> local_968;
  undefined8 local_958;
  char *pcStack_950;
  undefined8 local_948;
  char *pcStack_940;
  iterator local_930;
  size_type local_928;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_919;
  basic_string_view<char,_std::char_traits<char>_> local_918;
  undefined8 local_908;
  char *pcStack_900;
  iterator local_8f0;
  size_type local_8e8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_8d9;
  basic_string_view<char,_std::char_traits<char>_> local_8d8;
  undefined8 local_8c8;
  char *pcStack_8c0;
  undefined8 local_8b8;
  char *pcStack_8b0;
  undefined8 local_8a8;
  char *pcStack_8a0;
  iterator local_890;
  size_type local_888;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_879;
  basic_string_view<char,_std::char_traits<char>_> local_878;
  undefined8 local_868;
  char *pcStack_860;
  undefined8 local_858;
  char *pcStack_850;
  undefined8 local_848;
  char *pcStack_840;
  iterator local_830;
  size_type local_828;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_819;
  basic_string_view<char,_std::char_traits<char>_> local_818;
  undefined8 local_808;
  char *pcStack_800;
  undefined8 local_7f8;
  char *pcStack_7f0;
  undefined8 local_7e8;
  char *pcStack_7e0;
  undefined8 local_7d8;
  char *pcStack_7d0;
  undefined8 local_7c8;
  char *pcStack_7c0;
  iterator local_7b0;
  size_type local_7a8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_799;
  basic_string_view<char,_std::char_traits<char>_> local_798;
  undefined8 local_788;
  char *pcStack_780;
  undefined8 local_778;
  char *pcStack_770;
  undefined8 local_768;
  char *pcStack_760;
  undefined8 local_758;
  char *pcStack_750;
  undefined8 local_748;
  char *pcStack_740;
  iterator local_730;
  size_type local_728;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_719;
  basic_string_view<char,_std::char_traits<char>_> local_718;
  undefined8 local_708;
  char *pcStack_700;
  undefined8 local_6f8;
  char *pcStack_6f0;
  iterator local_6e0;
  size_type local_6d8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_6c9;
  basic_string_view<char,_std::char_traits<char>_> local_6c8;
  undefined8 local_6b8;
  char *pcStack_6b0;
  undefined8 local_6a8;
  char *pcStack_6a0;
  iterator local_690;
  size_type local_688;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_679;
  basic_string_view<char,_std::char_traits<char>_> local_678;
  undefined8 local_668;
  char *pcStack_660;
  undefined8 local_658;
  char *pcStack_650;
  undefined8 local_648;
  char *pcStack_640;
  undefined8 local_638;
  char *pcStack_630;
  iterator local_620;
  size_type local_618;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_609;
  basic_string_view<char,_std::char_traits<char>_> local_608;
  undefined8 local_5f8;
  char *pcStack_5f0;
  undefined8 local_5e8;
  char *pcStack_5e0;
  undefined8 local_5d8;
  char *pcStack_5d0;
  undefined8 local_5c8;
  char *pcStack_5c0;
  undefined8 local_5b8;
  char *pcStack_5b0;
  iterator local_5a0;
  size_type local_598;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_589;
  basic_string_view<char,_std::char_traits<char>_> local_588;
  undefined8 local_578;
  char *pcStack_570;
  undefined8 local_568;
  char *pcStack_560;
  undefined8 local_558;
  char *pcStack_550;
  undefined8 local_548;
  char *pcStack_540;
  iterator local_530;
  size_type local_528;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_519;
  basic_string_view<char,_std::char_traits<char>_> local_518;
  undefined8 local_508;
  char *pcStack_500;
  undefined8 local_4f8;
  char *pcStack_4f0;
  undefined8 local_4e8;
  char *pcStack_4e0;
  iterator local_4d0;
  size_type local_4c8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_4b9;
  basic_string_view<char,_std::char_traits<char>_> local_4b8;
  undefined8 local_4a8;
  char *pcStack_4a0;
  undefined8 local_498;
  char *pcStack_490;
  undefined8 local_488;
  char *pcStack_480;
  undefined8 local_478;
  char *pcStack_470;
  undefined8 local_468;
  char *pcStack_460;
  iterator local_450;
  size_type local_448;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_439;
  basic_string_view<char,_std::char_traits<char>_> local_438;
  undefined8 local_428;
  char *pcStack_420;
  undefined8 local_418;
  char *pcStack_410;
  undefined8 local_408;
  char *pcStack_400;
  undefined8 local_3f8;
  char *pcStack_3f0;
  undefined8 local_3e8;
  char *pcStack_3e0;
  iterator local_3d0;
  size_type local_3c8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_3b9;
  basic_string_view<char,_std::char_traits<char>_> local_3b8;
  undefined8 local_3a8;
  char *pcStack_3a0;
  undefined8 local_398;
  char *pcStack_390;
  undefined8 local_388;
  char *pcStack_380;
  iterator local_370;
  size_type local_368;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_359;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  undefined8 local_348;
  char *pcStack_340;
  undefined8 local_338;
  char *pcStack_330;
  undefined8 local_328;
  char *pcStack_320;
  undefined8 local_318;
  char *pcStack_310;
  undefined8 local_308;
  char *pcStack_300;
  iterator local_2f0;
  size_type local_2e8;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_2d9;
  basic_string_view<char,_std::char_traits<char>_> local_2d8;
  undefined8 local_2c8;
  char *pcStack_2c0;
  undefined8 local_2b8;
  char *pcStack_2b0;
  undefined8 local_2a8;
  char *pcStack_2a0;
  undefined8 local_298;
  char *pcStack_290;
  iterator local_280;
  size_type local_278;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_259;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  undefined8 local_248;
  char *pcStack_240;
  undefined8 local_238;
  char *pcStack_230;
  undefined8 local_228;
  char *pcStack_220;
  iterator local_218;
  size_type local_210;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_208;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_200;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1e8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1d0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1b8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_1a0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_188;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_170;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_158;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_140;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_128;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_110;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_f8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_e0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_c8;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_b0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_98;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_80;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_68;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_50;
  undefined1 local_38 [24];
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  cases2;
  TrivialRETest_Runnings_Test *this_local;
  
  __range1._6_1_ = 1;
  local_228 = 4;
  pcStack_220 = "+not";
  local_238 = 1;
  pcStack_230 = "+";
  local_248 = 2;
  pcStack_240 = "+a";
  local_258._M_len = 2;
  local_258._M_str = "a*";
  local_218 = &local_258;
  local_210 = 4;
  local_208 = &local_200;
  cases2.
  super__Vector_base<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_259);
  __l_17._M_len = local_210;
  __l_17._M_array = local_218;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_200,__l_17,&local_259);
  local_298 = 2;
  pcStack_290 = "-b";
  local_2a8 = 3;
  pcStack_2a0 = "+ba";
  local_2b8 = 4;
  pcStack_2b0 = "+aaa";
  local_2c8 = 2;
  pcStack_2c0 = "+a";
  local_2d8._M_len = 3;
  local_2d8._M_str = "aa*";
  local_280 = &local_2d8;
  local_278 = 5;
  local_208 = &local_1e8;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_2d9);
  __l_16._M_len = local_278;
  __l_16._M_array = local_280;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1e8,__l_16,&local_2d9);
  local_308 = 2;
  pcStack_300 = "-b";
  local_318 = 1;
  pcStack_310 = "-";
  local_328 = 4;
  pcStack_320 = "+aaa";
  local_338 = 3;
  pcStack_330 = "+aa";
  local_348 = 2;
  pcStack_340 = "+a";
  local_358._M_len = 2;
  local_358._M_str = "a+";
  local_2f0 = &local_358;
  local_2e8 = 6;
  local_208 = &local_1d0;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_359);
  __l_15._M_len = local_2e8;
  __l_15._M_array = local_2f0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1d0,__l_15,&local_359);
  local_388 = 1;
  pcStack_380 = "-";
  local_398 = 2;
  pcStack_390 = "+a";
  local_3a8 = 2;
  pcStack_3a0 = "-\n";
  local_3b8._M_len = 1;
  local_3b8._M_str = ".";
  local_370 = &local_3b8;
  local_368 = 4;
  local_208 = &local_1b8;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_3b9);
  __l_14._M_len = local_368;
  __l_14._M_array = local_370;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1b8,__l_14,&local_3b9);
  local_3e8 = 2;
  pcStack_3e0 = "--";
  local_3f8 = 2;
  pcStack_3f0 = "+f";
  local_408 = 1;
  pcStack_400 = "-";
  local_418 = 2;
  pcStack_410 = "-z";
  local_428 = 2;
  pcStack_420 = "+a";
  local_438._M_len = 5;
  local_438._M_str = "[a-f]";
  local_3d0 = &local_438;
  local_3c8 = 6;
  local_208 = &local_1a0;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_439);
  __l_13._M_len = local_3c8;
  __l_13._M_array = local_3d0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_1a0,__l_13,&local_439);
  local_468 = 2;
  pcStack_460 = "+-";
  local_478 = 2;
  pcStack_470 = "+f";
  local_488 = 1;
  pcStack_480 = "-";
  local_498 = 2;
  pcStack_490 = "-z";
  local_4a8 = 2;
  pcStack_4a0 = "+a";
  local_4b8._M_len = 6;
  local_4b8._M_str = "[a-f-]";
  local_450 = &local_4b8;
  local_448 = 6;
  local_208 = &local_188;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_4b9);
  __l_12._M_len = local_448;
  __l_12._M_array = local_450;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_188,__l_12,&local_4b9);
  local_4e8 = 2;
  pcStack_4e0 = "+z";
  local_4f8 = 2;
  pcStack_4f0 = "-b";
  local_508 = 2;
  pcStack_500 = "+a";
  local_518._M_len = 4;
  local_518._M_str = "[az]";
  local_4d0 = &local_518;
  local_4c8 = 4;
  local_208 = &local_170;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_519);
  __l_11._M_len = local_4c8;
  __l_11._M_array = local_4d0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_170,__l_11,&local_519);
  local_548 = 2;
  pcStack_540 = "-f";
  local_558 = 1;
  pcStack_550 = "-";
  local_568 = 2;
  pcStack_560 = "+z";
  local_578 = 2;
  pcStack_570 = "-a";
  local_588._M_len = 6;
  local_588._M_str = "[^a-f]";
  local_530 = &local_588;
  local_528 = 5;
  local_208 = &local_158;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_589);
  __l_10._M_len = local_528;
  __l_10._M_array = local_530;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_158,__l_10,&local_589);
  local_5b8 = 2;
  pcStack_5b0 = "--";
  local_5c8 = 2;
  pcStack_5c0 = "-f";
  local_5d8 = 1;
  pcStack_5d0 = "-";
  local_5e8 = 2;
  pcStack_5e0 = "+z";
  local_5f8 = 2;
  pcStack_5f0 = "-a";
  local_608._M_len = 7;
  local_608._M_str = "[^a-f-]";
  local_5a0 = &local_608;
  local_598 = 6;
  local_208 = &local_140;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_609);
  __l_09._M_len = local_598;
  __l_09._M_array = local_5a0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_140,__l_09,&local_609);
  local_638 = 2;
  pcStack_630 = "+9";
  local_648 = 2;
  pcStack_640 = "+0";
  local_658 = 2;
  pcStack_650 = "-z";
  local_668 = 2;
  pcStack_660 = "+a";
  local_678._M_len = 8;
  local_678._M_str = "[a-f0-9]";
  local_620 = &local_678;
  local_618 = 5;
  local_208 = &local_128;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_679);
  __l_08._M_len = local_618;
  __l_08._M_array = local_620;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_128,__l_08,&local_679);
  local_6a8 = 2;
  pcStack_6a0 = "+\n";
  local_6b8 = 2;
  pcStack_6b0 = "+a";
  local_6c8._M_len = 3;
  local_6c8._M_str = "[^]";
  local_690 = &local_6c8;
  local_688 = 3;
  local_208 = &local_110;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_6c9);
  __l_07._M_len = local_688;
  __l_07._M_array = local_690;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_110,__l_07,&local_6c9);
  local_6f8 = 7;
  pcStack_6f0 = "+asdasd";
  local_708 = 1;
  pcStack_700 = "+";
  local_718._M_len = 0;
  local_718._M_str = "";
  local_6e0 = &local_718;
  local_6d8 = 3;
  local_208 = &local_f8;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_719);
  __l_06._M_len = local_6d8;
  __l_06._M_array = local_6e0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_f8,__l_06,&local_719);
  local_748 = 3;
  pcStack_740 = "-ad";
  local_758 = 5;
  pcStack_750 = "+accd";
  local_768 = 5;
  pcStack_760 = "-abcd";
  local_778 = 3;
  pcStack_770 = "-ab";
  local_788 = 4;
  pcStack_780 = "+abd";
  local_798._M_len = 8;
  local_798._M_str = "a(b|c+)d";
  local_730 = &local_798;
  local_728 = 6;
  local_208 = &local_e0;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_799);
  __l_05._M_len = local_728;
  __l_05._M_array = local_730;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_e0,__l_05,&local_799);
  local_7c8 = 3;
  pcStack_7c0 = "+ad";
  local_7d8 = 5;
  pcStack_7d0 = "+accd";
  local_7e8 = 5;
  pcStack_7e0 = "-abcd";
  local_7f8 = 3;
  pcStack_7f0 = "-ab";
  local_808 = 4;
  pcStack_800 = "+abd";
  local_818._M_len = 9;
  local_818._M_str = "a(b|c+)?d";
  local_7b0 = &local_818;
  local_7a8 = 6;
  local_208 = &local_c8;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_819);
  __l_04._M_len = local_7a8;
  __l_04._M_array = local_7b0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_c8,__l_04,&local_819);
  local_848 = 4;
  pcStack_840 = "+b\na";
  local_858 = 3;
  pcStack_850 = "-ba";
  local_868 = 2;
  pcStack_860 = "+a";
  local_878._M_len = 2;
  local_878._M_str = "^a";
  local_830 = &local_878;
  local_828 = 4;
  local_208 = &local_b0;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_879);
  __l_03._M_len = local_828;
  __l_03._M_array = local_830;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_b0,__l_03,&local_879);
  local_8a8 = 4;
  pcStack_8a0 = "+b\na";
  local_8b8 = 3;
  pcStack_8b0 = "+ba";
  local_8c8 = 4;
  pcStack_8c0 = "+a\nb";
  local_8d8._M_len = 2;
  local_8d8._M_str = "a$";
  local_890 = &local_8d8;
  local_888 = 4;
  local_208 = &local_98;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_8d9);
  __l_02._M_len = local_888;
  __l_02._M_array = local_890;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_98,__l_02,&local_8d9);
  local_908 = 4;
  pcStack_900 = "+a\nb";
  local_918._M_len = 5;
  local_918._M_str = "a$\\nb";
  local_8f0 = &local_918;
  local_8e8 = 2;
  local_208 = &local_80;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_919);
  __l_01._M_len = local_8e8;
  __l_01._M_array = local_8f0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_80,__l_01,&local_919);
  local_948 = 4;
  pcStack_940 = "+aaa";
  local_958 = 1;
  pcStack_950 = "+";
  local_968._M_len = 1;
  local_968._M_str = "$";
  local_930 = &local_968;
  local_928 = 3;
  local_208 = &local_68;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_969);
  __l_00._M_len = local_928;
  __l_00._M_array = local_930;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_68,__l_00,&local_969);
  local_998 = 5;
  pcStack_990 = "+aaa\n";
  local_9a8 = 4;
  pcStack_9a0 = "-aaa";
  local_9b8 = 1;
  pcStack_9b0 = "+";
  local_9c8._M_len = 2;
  local_9c8._M_str = "^$";
  local_980 = &local_9c8;
  local_978 = 4;
  local_208 = &local_50;
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator
            ((allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             ((long)&__range1 + 7));
  __l._M_len = local_978;
  __l._M_array = local_980;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_50,__l,
           (allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
           ((long)&__range1 + 7));
  __range1._6_1_ = 0;
  local_38._0_8_ = &local_200;
  local_38._8_8_ = (pointer)0x13;
  std::
  allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::allocator((allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)((long)&__range1 + 5));
  __l_18._M_len = local_38._8_8_;
  __l_18._M_array = (iterator)local_38._0_8_;
  std::
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::vector((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
            *)(local_38 + 0x10),__l_18,
           (allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *)((long)&__range1 + 5));
  std::
  allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~allocator((allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                *)((long)&__range1 + 5));
  pvVar5 = &local_200;
  local_cb8 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_38;
  do {
    local_cb8 = local_cb8 + -1;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector(local_cb8);
  } while (local_cb8 != pvVar5);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator
            ((allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             ((long)&__range1 + 7));
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_969);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_919);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_8d9);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_879);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_819);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_799);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_719);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_6c9);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_679);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_609);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_589);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_519);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_4b9);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_439);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_3b9);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_359);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_2d9);
  std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_259);
  __end1 = std::
           vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
           ::begin((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                    *)(local_38 + 0x10));
  vec = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         *)std::
           vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
           ::end((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                  *)(local_38 + 0x10));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_std::vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                                *)&vec);
    if (!bVar1) break;
    m._M_invoker = (_Invoker_type)
                   __gnu_cxx::
                   __normal_iterator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_std::vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                   ::operator*(&__end1);
    pvVar2 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)m._M_invoker,0);
    local_a28 = (trivialre *)pvVar2->_M_len;
    pcStack_a20 = pvVar2->_M_str;
    str_00._M_str = (char *)pvVar5;
    str_00._M_len = (size_t)pcStack_a20;
    trivialre::CompileREOrDie((Matcher *)local_a10,local_a28,str_00);
    pvVar2 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)m._M_invoker,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_a48,pvVar2,&local_a49);
    uVar3 = std::__cxx11::string::c_str();
    trivialre::re_compiler::C<StringTestingBuilder,_trivialre::re_compiler::ErrorPolicy>::C
              (&local_a88,&local_a89);
    pvVar2 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)m._M_invoker,0);
    str._M_len = pvVar2->_M_len;
    str._M_str = pvVar2->_M_str;
    trivialre::re_compiler::C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy>::
    CompileOrDie_abi_cxx11_
              (&local_a70,(C<StringTestingBuilder,trivialre::re_compiler::ErrorPolicy> *)&local_a88,
               str);
    uVar4 = std::__cxx11::string::c_str();
    printf("testing /%s/ re: %s\n",uVar3,uVar4);
    std::__cxx11::string::~string((string *)&local_a70);
    std::__cxx11::string::~string(local_a48);
    std::allocator<char>::~allocator(&local_a49);
    local_ab0 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)0x1;
    while( true ) {
      pvVar5 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)std::
                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)m._M_invoker);
      if (pvVar5 <= local_ab0) break;
      pvVar2 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             *)m._M_invoker,(size_type)local_ab0);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )pvVar2->_M_len;
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_);
      pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_);
      printf("trying: %.*s\n",sVar6 & 0xffffffff,pvVar7);
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,0)
      ;
      if (*pvVar8 == '+') {
        bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
                            1,0xffffffffffffffff);
        str_01._M_len = bVar11._M_str;
        str_01._M_str = (char *)bVar11._M_len;
        local_af0 = bVar11;
        local_ad9 = trivialre::MatchSubstring
                              ((trivialre *)local_a10,(Matcher *)bVar11._M_len,str_01);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_ad8,&local_ad9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ad8);
        if (!bVar1) {
          testing::Message::Message(&local_af8);
          pMVar9 = testing::Message::operator<<(&local_af8,(char (*) [5])"re: ");
          pvVar2 = std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)m._M_invoker,0);
          pMVar9 = testing::Message::operator<<(pMVar9,pvVar2);
          pMVar9 = testing::Message::operator<<(pMVar9,(char (*) [5])" s: ");
          pMVar9 = testing::Message::operator<<
                             (pMVar9,(basic_string_view<char,_std::char_traits<char>_> *)
                                     &gtest_ar_.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__1.message_,(internal *)local_ad8,
                     (AssertionResult *)"MatchSubstring(m, s.substr(1))","false","true",in_R9);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_b00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                     ,0xaa,pcVar10);
          testing::internal::AssertHelper::operator=(&local_b00,pMVar9);
          testing::internal::AssertHelper::~AssertHelper(&local_b00);
          std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_af8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_ad8);
      }
      else {
        bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
                            1,0xffffffffffffffff);
        str_02._M_len = bVar11._M_str;
        str_02._M_str = (char *)bVar11._M_len;
        local_b48 = bVar11;
        bVar1 = trivialre::MatchSubstring((trivialre *)local_a10,(Matcher *)bVar11._M_len,str_02);
        local_b31 = (bool)(~bVar1 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_b30,&local_b31,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
        if (!bVar1) {
          testing::Message::Message(&local_b50);
          pMVar9 = testing::Message::operator<<(&local_b50,(char (*) [5])"re: ");
          pvVar2 = std::
                   vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)m._M_invoker,0);
          pMVar9 = testing::Message::operator<<(pMVar9,pvVar2);
          pMVar9 = testing::Message::operator<<(pMVar9,(char (*) [5])" s: ");
          pMVar9 = testing::Message::operator<<
                             (pMVar9,(basic_string_view<char,_std::char_traits<char>_> *)
                                     &gtest_ar_.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b78,(internal *)local_b30,
                     (AssertionResult *)"MatchSubstring(m, s.substr(1))","true","false",in_R9);
          pcVar10 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_b58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                     ,0xad,pcVar10);
          testing::internal::AssertHelper::operator=(&local_b58,pMVar9);
          testing::internal::AssertHelper::~AssertHelper(&local_b58);
          std::__cxx11::string::~string((string *)&local_b78);
          testing::Message::~Message(&local_b50);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
      }
      local_ab0 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)((long)&(local_ab0->
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    std::
    function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
    ::~function((function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                 *)local_a10);
    __gnu_cxx::
    __normal_iterator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_*,_std::vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
             *)(local_38 + 0x10));
  return;
}

Assistant:

TEST(TrivialRETest, Runnings) {
  // Format is {re, example...}. Each example is prefixed with '+' for
  // must match or '-' for must not.
  std::vector<std::vector<std::string_view>> cases2 = {
      {"a*", "+a", "+", "+not"},
      {"aa*", "+a", "+aaa", "+ba", "-b"},
      {"a+", "+a", "+aa", "+aaa", "-", "-b"},
      {".", "-\n", "+a", "-"},

      {"[a-f]", "+a", "-z", "-", "+f", "--"},
      {"[a-f-]", "+a", "-z", "-", "+f", "+-"},
      {"[az]", "+a", "-b", "+z"},
      {"[^a-f]", "-a", "+z", "-", "-f"},
      {"[^a-f-]", "-a", "+z", "-", "-f", "--"},
      {"[a-f0-9]", "+a", "-z", "+0", "+9"},
      {"[^]", "+a", "+\n"},
      {"", "+", "+asdasd"},

      {"a(b|c+)d", "+abd", "-ab", "-abcd", "+accd", "-ad"},
      {"a(b|c+)?d", "+abd", "-ab", "-abcd", "+accd", "+ad"},

      {"^a", "+a", "-ba", "+b\na"},
      {"a$", "+a\nb", "+ba", "+b\na"},
      {"a$\\nb", "+a\nb"},
      {"$", "+", "+aaa"},
      {"^$", "+", "-aaa", "+aaa\n"},
  };

  for (const auto& vec : cases2) {
    Matcher m = CompileREOrDie(vec[0]);
    printf("testing /%s/ re: %s\n", std::string(vec[0]).c_str(),
           trivialre::re_compiler::C<StringTestingBuilder>({}).CompileOrDie(vec[0])
               .c_str());
    for (size_t i = 1; i < vec.size(); i++) {
      std::string_view s = vec[i];
      printf("trying: %.*s\n", int(s.size()), s.data());
      if (s[0] == '+') {
        EXPECT_TRUE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      } else {
        assert(s[0] == '-');
        EXPECT_FALSE(MatchSubstring(m, s.substr(1))) << "re: " << vec[0] << " s: " << s;
      }
    }
  }
}